

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvkgen.cpp
# Opt level: O3

void __thiscall VkSpecParser::skip(VkSpecParser *this)

{
  char cVar1;
  int iVar2;
  long in_FS_OFFSET;
  QStringView QVar3;
  undefined1 auVar4 [16];
  QStringView QVar5;
  QString local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.d.size = -0x5555555555555556;
  local_38.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_38.d.ptr = (storage_type_conflict *)0xaaaaaaaaaaaaaaaa;
  auVar4 = QXmlStreamReader::name();
  QString::QString(&local_38,auVar4._8_8_,auVar4._0_8_);
  do {
    do {
      do {
        cVar1 = QXmlStreamReader::atEnd();
        if (cVar1 != '\0') goto LAB_00103443;
        QXmlStreamReader::readNext();
        iVar2 = QXmlStreamReader::tokenType();
      } while (iVar2 != 5);
      QVar5 = (QStringView)QXmlStreamReader::name();
    } while (QVar5.m_size != local_38.d.size);
    QVar3.m_data = local_38.d.ptr;
    QVar3.m_size = QVar5.m_size;
    cVar1 = QtPrivate::equalStrings(QVar5,QVar3);
  } while (cVar1 == '\0');
LAB_00103443:
  if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void VkSpecParser::skip()
{
    QString tag = m_reader.name().toString();
    while (!m_reader.atEnd()) {
        m_reader.readNext();
        if (m_reader.isEndElement() && m_reader.name() == tag)
            break;
    }
}